

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O1

void __thiscall
embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication
          (SceneLoadingTutorialApplication *this,string *tutorialName,int features)

{
  CommandLineParser *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
  *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  atomic<unsigned_long> *paVar2;
  GroupNode *this_02;
  CommandLineOption *pCVar3;
  mapped_type *pmVar4;
  Ref<embree::CommandLineParser::CommandLineOption> closure;
  value_type local_b0;
  key_type local_a8;
  string local_88;
  undefined1 *local_68;
  long local_60;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  undefined1 *local_38;
  
  TutorialApplication::TutorialApplication
            (&this->super_TutorialApplication,tutorialName,features,0x200,0x200);
  (this->super_TutorialApplication).super_Application._vptr_Application =
       (_func_int **)&PTR__SceneLoadingTutorialApplication_002c2e48;
  local_38 = &(this->super_TutorialApplication).field_0x318;
  TutorialScene::TutorialScene((TutorialScene *)local_38);
  this_02 = (GroupNode *)operator_new(0x80);
  SceneGraph::GroupNode::GroupNode(this_02,0);
  (this->scene).ptr = this_02;
  (*(this_02->super_Node).super_RefCount._vptr_RefCount[2])(this_02);
  (this->futures).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->futures).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sgop).
  super__Vector_base<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->futures).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sgop).
  super__Vector_base<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sgop).
  super__Vector_base<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->convert_tris_to_quads_prop = INFINITY;
  this->grid_resX = 2;
  this->grid_resY = 2;
  this->remove_mblur = false;
  this->remove_non_mblur = false;
  local_40 = &(this->subdiv_mode).field_2;
  (this->sceneFilename).super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sceneFilename).super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sceneFilename).super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->keyFramesFilenames).super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->keyFramesFilenames).super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->keyFramesFilenames).super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->instancing_mode = INSTANCING_NONE;
  (this->subdiv_mode)._M_dataplus._M_p = (pointer)local_40;
  (this->subdiv_mode)._M_string_length = 0;
  (this->subdiv_mode).field_2._M_local_buf[0] = '\0';
  this->print_scene_cameras = false;
  local_48 = &(this->camera_name).field_2;
  (this->camera_name)._M_dataplus._M_p = (pointer)local_48;
  (this->camera_name)._M_string_length = 0;
  (this->camera_name).field_2._M_local_buf[0] = '\0';
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"i","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"-i <filename>: parses scene from <filename>","");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c3618;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  this_00 = &(this->super_TutorialApplication).super_Application.commandLineParser;
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  this_01 = &(this->super_TutorialApplication).super_Application.commandLineParser.
             commandLineOptionMap;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"animlist","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "-animlist <filename>: parses a sequence of .obj/.xml files listed in <filename> and adds them to the scene"
             ,"");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c3668;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"convert-triangles-to-quads","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--convert-triangles-to-quads: converts all triangles to quads when loading","");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c36b8;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"convert-triangles-to-triangles-and-quads","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--convert-triangles-to-triangles-and-quads: converts to mixed triangle/quad scene","")
  ;
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c3708;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"convert-bezier-to-lines","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--convert-bezier-to-lines: converts all bezier curves to line segments when loading",
             "");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c3758;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"convert-flat-to-round-curves","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--convert-flat-to-round-curves: converts all flat curves to round curves","");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c37a8;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"convert-flat-to-round-curves","");
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"convert-hair-to-curves","");
  CommandLineParser::registerOptionAlias(this_00,&local_88,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"convert-round-to-flat-curves","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--convert-round-to-flat-curves: converts all round curves to flat curves","");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c37f8;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"convert-bezier-to-bspline","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--convert-bezier-to-bspline: converts all bezier curves to bsplines curves","");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c3848;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"convert-bspline-to-bezier","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--convert-bspline-to-bezier: converts all bsplines curves to bezier curves","");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c3898;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"convert-bezier-to-hermite","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--convert-bezier-to-hermite: converts all bezier curves to hermite curves","");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c38e8;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"merge-triangles-to-grids","")
  ;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"--merge-triangles-to-grids: merges quads to grids","");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c3938;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"merge-quads-to-grids","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"--merge-quads-to-grids: merges quads to grids","");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c3988;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"convert-quads-to-grids","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"--convert-quads-to-grids: converts all quads to grids","");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c39d8;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"convert-grids-to-quads","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"--convert-grids-to-quads: converts all grids to quads","");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c3a28;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"convert-triangles-to-grids","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"--convert-triangles-to-grids: converts all triangles to grids","")
  ;
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c3a78;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"convert-triangles-to-grids-to-quads","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--convert-triangles-to-grids-to-quads: converts all triangles to grids and then to quads"
             ,"");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c3ac8;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"grid-res","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"--grid-res: sets tessellation resolution for the grid primitive",
             "");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c3b18;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"convert-mblur-to-nonmblur","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--convert-mblur-to-nonmblur: converts all motion blur geometry to non-motion blur geometry"
             ,"");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c3b68;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"remove-mblur","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"--remove-mblur: removes all motion blur geometry","");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c3bb8;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"remove-non-mblur","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"--remove-non-mblur: removes all non-motion blur geometry","");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c3c08;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"instancing","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--instancing: set instancing mode\n  none: perform no instancing and flatten entire scene\n  geometry: instance individual geometries as scenes\n  group: instance geometry groups as scenes\n  multi_level: use multi-level instancing\n  flattened: assume flattened scene graph"
             ,"");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c3c58;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"animation","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"--animation: render animated geometries","");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c3ca8;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"ambientlight","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"--ambientlight r g b: adds an ambient light with intensity rgb",""
            );
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c3cf8;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"ambientlight","");
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"ambient","");
  CommandLineParser::registerOptionAlias(this_00,&local_88,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"pointlight","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--pointlight x y z r g b: adds a point light at position xyz with intensity rgb","");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c3d58;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"directionallight","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--directionallight x y z r g b: adds a directional light with direction xyz and intensity rgb"
             ,"");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c3db8;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"directionallight","");
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"dirlight","");
  CommandLineParser::registerOptionAlias(this_00,&local_88,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"distantlight","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--distantlight x y z r g b a: adds a distant light with direction xyz, intensity rgb, and opening angle a"
             ,"");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c3e18;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"triangle-plane","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--triangle-plane p.x p.y p.z dx.x dx.y dx.z dy.x dy.y dy.z width height: adds a plane build of triangles originated at p0 and spanned by the vectors dx and dy with a tessellation width/height."
             ,"");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c3e78;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"quad-plane","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--quad-plane p.x p.y p.z dx.x dx.y dx.z dy.x dy.y dy.z width height: adds a plane build of quadrilaterals originated at p0 and spanned by the vectors dx and dy with a tessellation width/height."
             ,"");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c3ed8;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"grid-plane","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--grid-plane p.x p.y p.z dx.x dx.y dx.z dy.x dy.y dy.z width height: adds a plane using a grid mesh build. The plane is originated at p0 and spanned by the vectors dx and dy with a tessellation width/height."
             ,"");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c3f38;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"subdiv-plane","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--subdiv-plane p.x p.y p.z dx.x dx.y dx.z dy.x dy.y dy.z width height tessellationRate: adds a plane build as a Catmull Clark subdivision surface originated at p0 and spanned by the vectors dx and dy. The plane consists of widt x height many patches, and each patch has the specified tessellation rate."
             ,"");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c3f98;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"hair-plane","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--hair-plane p.x p.y p.z dx.x dx.y dx.z dy.x dy.y dy.z length radius num: adds a hair plane originated at p0 and spanned by the vectors dx and dy. num hairs are generated with specified length and radius."
             ,"");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c3ff8;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"curve-plane","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--curve-plane p.x p.y p.z dx.x dx.y dx.z dy.x dy.y dy.z length radius: adds a plane build of bezier curves originated at p0 and spanned by the vectors dx and dy. num curves are generated with specified length and radius."
             ,"");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4058;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"sphere","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"--sphere p.x p.y p.z r: adds a sphere at position p with radius r"
             ,"");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c40b8;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"triangle-sphere","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--triangle-sphere p.x p.y p.z r numPhi: adds a sphere at position p with radius r and tessellation numPhi build of triangles."
             ,"");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4118;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"quad-sphere","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--quad-sphere p.x p.y p.z r numPhi: adds a sphere at position p with radius r and tessellation numPhi build of quadrilaterals."
             ,"");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4178;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"grid-sphere","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--grid-sphere p.x p.y p.z r N: adds a grid sphere at position p with radius r using a cube topology and N*N quads at each face."
             ,"");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c41d8;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"triangle-sphere-mblur","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--triangle-sphere-mblur p.x p.y p.z d.x d.y d.z r numPhi : adds a motion blurred sphere build of triangles at position p, with motion vector d, radius r, and tessellation numPhi."
             ,"");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4238;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"quad-sphere-mblur","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--quad-sphere-mblur p.x p.y p.z d.x d.y d.z r numPhi : adds a motion blurred sphere build of quadrilaterals at position p, with motion vector d, radius r, and tessellation numPhi."
             ,"");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4298;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"subdiv-sphere","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--subdiv-sphere p.x p.y p.z r numPhi: adds a sphere at position p with radius r build of Catmull Clark subdivision surfaces. The sphere consists of numPhi x numPhi many patches and each path has the specified tessellation rate."
             ,"");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c42f8;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"point-sphere","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--point-sphere p.x p.y p.z r pointR numPhi: adds a sphere at position p with radius r and tessellation numPhi build of spheres."
             ,"");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4358;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"point-sphere-mblur","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--point-sphere p.x p.y p.z d.x d.y d.z r pointR numPhi: adds a sphere at position p, motion vector d, with radius r and tessellation numPhi build of spheres."
             ,"");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c43b8;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"disc-sphere","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--disc-sphere p.x p.y p.z r pointR numPhi: adds a sphere at position p with radius r and tessellation numPhi build of discs."
             ,"");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4418;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"oriented-disc-sphere","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "--oriented-disc-sphere p.x p.y p.z r pointR numPhi: adds a sphere at position p with radius r and tessellation numPhi build of oriented discs."
             ,"");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4478;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"print-cameras","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"--print-cameras: prints all camera names of the scene","");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c44d8;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"camera","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"--camera: use camera with specified name","");
  pCVar3 = (CommandLineOption *)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  (pCVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
  (pCVar3->description)._M_dataplus._M_p = (pointer)&(pCVar3->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->description,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4528;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar2 = &(pCVar3->super_RefCount).refCounter;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_b0.ptr = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_a8);
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = local_b0.ptr;
  if (local_b0.ptr != (CommandLineOption *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return;
}

Assistant:

SceneLoadingTutorialApplication::SceneLoadingTutorialApplication (const std::string& tutorialName, int features)

    : TutorialApplication(tutorialName, features),
      scene(new SceneGraph::GroupNode),
      convert_tris_to_quads_prop(inf),
      grid_resX(2),
      grid_resY(2),
      remove_mblur(false),
      remove_non_mblur(false),
      sceneFilename(),
      instancing_mode(SceneGraph::INSTANCING_NONE),
      print_scene_cameras(false)
  {
    registerOption("i", [this] (Ref<ParseStream> cin, const FileName& path) {
        sceneFilename.push_back(path + cin->getFileName());
      }, "-i <filename>: parses scene from <filename>");

    registerOption("animlist", [this] (Ref<ParseStream> cin, const FileName& path) {
        FileName listFilename = path + cin->getFileName();

        std::ifstream listFile;
        listFile.open(listFilename.c_str());
        if (!listFile.is_open()) {
          THROW_RUNTIME_ERROR("cannot open " + listFilename.str());
        }
        else
        {
          while (!listFile.eof())
          {
            std::string line;
            listFile >> line;
            if (line != "")
              keyFramesFilenames.push_back(listFilename.path() + line);
          }
        }
      }, "-animlist <filename>: parses a sequence of .obj/.xml files listed in <filename> and adds them to the scene");

    registerOption("convert-triangles-to-quads", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(CONVERT_TRIANGLES_TO_QUADS);
        convert_tris_to_quads_prop = inf;
      }, "--convert-triangles-to-quads: converts all triangles to quads when loading");

    registerOption("convert-triangles-to-triangles-and-quads", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(CONVERT_TRIANGLES_TO_QUADS);
        convert_tris_to_quads_prop = 0.5f;
      }, "--convert-triangles-to-triangles-and-quads: converts to mixed triangle/quad scene");

    registerOption("convert-bezier-to-lines", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(CONVERT_BEZIER_TO_LINES);
      }, "--convert-bezier-to-lines: converts all bezier curves to line segments when loading");

    registerOption("convert-flat-to-round-curves", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(CONVERT_FLAT_TO_ROUND_CURVES);
      }, "--convert-flat-to-round-curves: converts all flat curves to round curves");
    registerOptionAlias("convert-flat-to-round-curves","convert-hair-to-curves"); // for compatibility reasons

    registerOption("convert-round-to-flat-curves", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(CONVERT_ROUND_TO_FLAT_CURVES);
      }, "--convert-round-to-flat-curves: converts all round curves to flat curves");
    
    registerOption("convert-bezier-to-bspline", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(CONVERT_BEZIER_TO_BSPLINE);
      }, "--convert-bezier-to-bspline: converts all bezier curves to bsplines curves");

    registerOption("convert-bspline-to-bezier", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(CONVERT_BSPLINE_TO_BEZIER);
      }, "--convert-bspline-to-bezier: converts all bsplines curves to bezier curves");

    registerOption("convert-bezier-to-hermite", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(CONVERT_BEZIER_TO_HERMITE);
      }, "--convert-bezier-to-hermite: converts all bezier curves to hermite curves");

    registerOption("merge-triangles-to-grids", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(CONVERT_TRIANGLES_TO_QUADS);
        sgop.push_back(MERGE_QUADS_TO_GRIDS);
      }, "--merge-triangles-to-grids: merges quads to grids");
    
    registerOption("merge-quads-to-grids", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(MERGE_QUADS_TO_GRIDS);
      }, "--merge-quads-to-grids: merges quads to grids");

    registerOption("convert-quads-to-grids", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(CONVERT_QUADS_TO_GRIDS);
      }, "--convert-quads-to-grids: converts all quads to grids");

    registerOption("convert-grids-to-quads", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(CONVERT_GRIDS_TO_QUADS);
      }, "--convert-grids-to-quads: converts all grids to quads");

    registerOption("convert-triangles-to-grids", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(CONVERT_TRIANGLES_TO_QUADS);
        sgop.push_back(CONVERT_QUADS_TO_GRIDS);
      }, "--convert-triangles-to-grids: converts all triangles to grids");

    registerOption("convert-triangles-to-grids-to-quads", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(CONVERT_TRIANGLES_TO_QUADS);
        sgop.push_back(CONVERT_QUADS_TO_GRIDS);
        sgop.push_back(CONVERT_GRIDS_TO_QUADS);
      }, "--convert-triangles-to-grids-to-quads: converts all triangles to grids and then to quads");

    registerOption("grid-res", [this] (Ref<ParseStream> cin, const FileName& path) {
        grid_resX = min(max(cin->getInt(),2),0x7fff);
        grid_resY = min(max(cin->getInt(),2),0x7fff);        
      }, "--grid-res: sets tessellation resolution for the grid primitive");

    registerOption("convert-mblur-to-nonmblur", [this] (Ref<ParseStream> cin, const FileName& path) {
         sgop.push_back(CONVERT_MBLUR_TO_NONMBLUR);
      }, "--convert-mblur-to-nonmblur: converts all motion blur geometry to non-motion blur geometry");
    
    registerOption("remove-mblur", [this] (Ref<ParseStream> cin, const FileName& path) {
         remove_mblur = true;
      }, "--remove-mblur: removes all motion blur geometry");

    registerOption("remove-non-mblur", [this] (Ref<ParseStream> cin, const FileName& path) {
         remove_non_mblur = true;
      }, "--remove-non-mblur: removes all non-motion blur geometry");

    registerOption("instancing", [this] (Ref<ParseStream> cin, const FileName& path) {
        std::string mode = cin->getString();
        if      (mode == "none"    ) instancing_mode = SceneGraph::INSTANCING_NONE;
        else if (mode == "scene_geometry") instancing_mode = SceneGraph::INSTANCING_GEOMETRY; // for compatibility
        else if (mode == "scene_group"   ) instancing_mode = SceneGraph::INSTANCING_GROUP; // for compatibility
        else if (mode == "geometry") instancing_mode = SceneGraph::INSTANCING_GEOMETRY;
        else if (mode == "group"   ) instancing_mode = SceneGraph::INSTANCING_GROUP;
        else if (mode == "flattened") instancing_mode = SceneGraph::INSTANCING_FLATTENED;
        else if (mode == "multi_level") instancing_mode = SceneGraph::INSTANCING_MULTI_LEVEL;
        else throw std::runtime_error("unknown instancing mode: "+mode);
        g_instancing_mode = instancing_mode;
      }, "--instancing: set instancing mode\n"
      "  none: perform no instancing and flatten entire scene\n"
      "  geometry: instance individual geometries as scenes\n"
      "  group: instance geometry groups as scenes\n"
      "  multi_level: use multi-level instancing\n"
      "  flattened: assume flattened scene graph");

    registerOption("animation", [] (Ref<ParseStream> cin, const FileName& path) {
         g_animation_mode = true;
      }, "--animation: render animated geometries");

    registerOption("ambientlight", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f L = cin->getVec3f();
        futures.push_back([=]() { scene->add(new SceneGraph::LightNodeImpl<SceneGraph::AmbientLight>(SceneGraph::AmbientLight(L))); });
      }, "--ambientlight r g b: adds an ambient light with intensity rgb");
    registerOptionAlias("ambientlight","ambient");

    registerOption("pointlight", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f P = cin->getVec3f();
        const Vec3f I = cin->getVec3f();
        futures.push_back([=]() { scene->add(new SceneGraph::LightNodeImpl<SceneGraph::PointLight>(SceneGraph::PointLight(P,I))); });
      }, "--pointlight x y z r g b: adds a point light at position xyz with intensity rgb");

    registerOption("directionallight", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f D = cin->getVec3f();
        const Vec3f E = cin->getVec3f();
        futures.push_back([=]() { scene->add(new SceneGraph::LightNodeImpl<SceneGraph::DirectionalLight>(SceneGraph::DirectionalLight(D,E))); });
      }, "--directionallight x y z r g b: adds a directional light with direction xyz and intensity rgb");
    registerOptionAlias("directionallight","dirlight");

    registerOption("distantlight", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f D = cin->getVec3f();
        const Vec3f L = cin->getVec3f();
        const float halfAngle = cin->getFloat();
        futures.push_back([=]() { scene->add(new SceneGraph::LightNodeImpl<SceneGraph::DistantLight>(SceneGraph::DistantLight(D,L,halfAngle))); });
      }, "--distantlight x y z r g b a: adds a distant light with direction xyz, intensity rgb, and opening angle a");

    registerOption("triangle-plane", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p0 = cin->getVec3f();
        const Vec3f dx = cin->getVec3f();
        const Vec3f dy = cin->getVec3f();
        const size_t width = cin->getInt();
        const size_t height = cin->getInt();
        futures.push_back([=]() { scene->add(SceneGraph::createTrianglePlane(p0,dx,dy,width,height,new OBJMaterial)); });
      }, "--triangle-plane p.x p.y p.z dx.x dx.y dx.z dy.x dy.y dy.z width height: adds a plane build of triangles originated at p0 and spanned by the vectors dx and dy with a tessellation width/height.");

    registerOption("quad-plane", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p0 = cin->getVec3f();
        const Vec3f dx = cin->getVec3f();
        const Vec3f dy = cin->getVec3f();
        const size_t width = cin->getInt();
        const size_t height = cin->getInt();
        futures.push_back([=]() { scene->add(SceneGraph::createQuadPlane(p0,dx,dy,width,height,new OBJMaterial)); });
      }, "--quad-plane p.x p.y p.z dx.x dx.y dx.z dy.x dy.y dy.z width height: adds a plane build of quadrilaterals originated at p0 and spanned by the vectors dx and dy with a tessellation width/height.");

    registerOption("grid-plane", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p0 = cin->getVec3f();
        const Vec3f dx = cin->getVec3f();
        const Vec3f dy = cin->getVec3f();
        const size_t width = cin->getInt();
        const size_t height = cin->getInt();
        futures.push_back([=]() { scene->add(SceneGraph::createGridPlane(p0,dx,dy,width,height,new OBJMaterial)); });
      }, "--grid-plane p.x p.y p.z dx.x dx.y dx.z dy.x dy.y dy.z width height: adds a plane using a grid mesh build. The plane is originated at p0 and spanned by the vectors dx and dy with a tessellation width/height.");

    registerOption("subdiv-plane", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p0 = cin->getVec3f();
        const Vec3f dx = cin->getVec3f();
        const Vec3f dy = cin->getVec3f();
        const size_t width = cin->getInt();
        const size_t height = cin->getInt();
        const float tessellationRate = cin->getFloat();
        futures.push_back([=]() { scene->add(SceneGraph::createSubdivPlane(p0,dx,dy,width,height,tessellationRate,new OBJMaterial)); });
      }, "--subdiv-plane p.x p.y p.z dx.x dx.y dx.z dy.x dy.y dy.z width height tessellationRate: adds a plane build as a Catmull Clark subdivision surface originated at p0 and spanned by the vectors dx and dy. The plane consists of widt x height many patches, and each patch has the specified tessellation rate.");

    registerOption("hair-plane", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p0 = cin->getVec3f();
        const Vec3f dx = cin->getVec3f();
        const Vec3f dy = cin->getVec3f();
        const float len = cin->getFloat();
        const float r = cin->getFloat();
        const size_t N = cin->getInt();
        futures.push_back([=]() { scene->add(SceneGraph::createHairyPlane(0,p0,dx,dy,len,r,N,SceneGraph::FLAT_CURVE,new OBJMaterial)); });
      }, "--hair-plane p.x p.y p.z dx.x dx.y dx.z dy.x dy.y dy.z length radius num: adds a hair plane originated at p0 and spanned by the vectors dx and dy. num hairs are generated with specified length and radius.");

    registerOption("curve-plane", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p0 = cin->getVec3f();
        const Vec3f dx = cin->getVec3f();
        const Vec3f dy = cin->getVec3f();
        const float len = cin->getFloat();
        const float r = cin->getFloat();
        const size_t N = cin->getInt();
        futures.push_back([=]() { scene->add(SceneGraph::createHairyPlane(0,p0,dx,dy,len,r,N,SceneGraph::ROUND_CURVE,new OBJMaterial)); });
      }, "--curve-plane p.x p.y p.z dx.x dx.y dx.z dy.x dy.y dy.z length radius: adds a plane build of bezier curves originated at p0 and spanned by the vectors dx and dy. num curves are generated with specified length and radius.");

     registerOption("sphere", [this] (Ref<ParseStream> cin, const FileName& path) {
         const Vec3f p = cin->getVec3f();
        const float  r = cin->getFloat();
        futures.push_back([=]() { scene->add(SceneGraph::createSphere(p, r, new OBJMaterial)); });
      }, "--sphere p.x p.y p.z r: adds a sphere at position p with radius r");
     
    registerOption("triangle-sphere", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p = cin->getVec3f();
        const float  r = cin->getFloat();
        const size_t numPhi = cin->getInt();
        futures.push_back([=]() { scene->add(SceneGraph::createTriangleSphere(p,r,numPhi,new OBJMaterial)); });
      }, "--triangle-sphere p.x p.y p.z r numPhi: adds a sphere at position p with radius r and tessellation numPhi build of triangles.");

    registerOption("quad-sphere", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p = cin->getVec3f();
        const float  r = cin->getFloat();
        const size_t numPhi = cin->getInt();
        futures.push_back([=]() { scene->add(SceneGraph::createQuadSphere(p,r,numPhi,new OBJMaterial)); });
      }, "--quad-sphere p.x p.y p.z r numPhi: adds a sphere at position p with radius r and tessellation numPhi build of quadrilaterals.");

    registerOption("grid-sphere", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p = cin->getVec3f();
        const float  r = cin->getFloat();
        const size_t N = cin->getInt();
        futures.push_back([=]() { scene->add(SceneGraph::createGridSphere(p,r,N,new OBJMaterial)); });
      }, "--grid-sphere p.x p.y p.z r N: adds a grid sphere at position p with radius r using a cube topology and N*N quads at each face.");

    registerOption("triangle-sphere-mblur", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p = cin->getVec3f();
        const Vec3f dp = cin->getVec3f();
        const float  r = cin->getFloat();
        const size_t numPhi = cin->getInt();
        futures.push_back([=]() {
          Ref<SceneGraph::Node> mesh = SceneGraph::createTriangleSphere(p,r,numPhi,new OBJMaterial);
          mesh->set_motion_vector(dp); 
          scene->add(mesh);
        });
      }, "--triangle-sphere-mblur p.x p.y p.z d.x d.y d.z r numPhi : adds a motion blurred sphere build of triangles at position p, with motion vector d, radius r, and tessellation numPhi.");

    registerOption("quad-sphere-mblur", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p = cin->getVec3f();
        const Vec3f dp = cin->getVec3f();
        const float  r = cin->getFloat();
        const size_t numPhi = cin->getInt();
        futures.push_back([=]() {
          Ref<SceneGraph::Node> mesh = SceneGraph::createQuadSphere(p,r,numPhi,new OBJMaterial);
          mesh->set_motion_vector(dp); 
          scene->add(mesh);
        });
      }, "--quad-sphere-mblur p.x p.y p.z d.x d.y d.z r numPhi : adds a motion blurred sphere build of quadrilaterals at position p, with motion vector d, radius r, and tessellation numPhi.");

    registerOption("subdiv-sphere", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p = cin->getVec3f();
        const float  r = cin->getFloat();
        const size_t numPhi = cin->getInt();
        const float tessellationRate = cin->getFloat();
        futures.push_back([=]() { scene->add(SceneGraph::createSubdivSphere(p,r,numPhi,tessellationRate,new OBJMaterial)); });
      }, "--subdiv-sphere p.x p.y p.z r numPhi: adds a sphere at position p with radius r build of Catmull Clark subdivision surfaces. The sphere consists of numPhi x numPhi many patches and each path has the specified tessellation rate.");

    registerOption("point-sphere", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p = cin->getVec3f();
        const float  r = cin->getFloat();
        const float pointR = cin->getFloat();
        const size_t numPhi = cin->getInt();
        futures.push_back([=]() { scene->add(SceneGraph::createPointSphere(p, r, pointR, numPhi, SceneGraph::SPHERE, new OBJMaterial)); });
      }, "--point-sphere p.x p.y p.z r pointR numPhi: adds a sphere at position p with radius r and tessellation numPhi build of spheres.");

     registerOption("point-sphere-mblur", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p = cin->getVec3f();
        const Vec3f dp = cin->getVec3f();
        const float  r = cin->getFloat();
        const float pointR = cin->getFloat();
        const size_t numPhi = cin->getInt();
        futures.push_back([=]() { scene->add(SceneGraph::createPointSphere(p, r, pointR, numPhi, SceneGraph::SPHERE, new OBJMaterial)->set_motion_vector(dp)); });
      }, "--point-sphere p.x p.y p.z d.x d.y d.z r pointR numPhi: adds a sphere at position p, motion vector d, with radius r and tessellation numPhi build of spheres.");

    registerOption("disc-sphere", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p = cin->getVec3f();
        const float  r = cin->getFloat();
        const float pointR = cin->getFloat();
        const size_t numPhi = cin->getInt();
        futures.push_back([=]() { scene->add(SceneGraph::createPointSphere(p, r, pointR, numPhi, SceneGraph::DISC, new OBJMaterial)); });
      }, "--disc-sphere p.x p.y p.z r pointR numPhi: adds a sphere at position p with radius r and tessellation numPhi build of discs.");

    registerOption("oriented-disc-sphere", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p = cin->getVec3f();
        const float  r = cin->getFloat();
        const float pointR = cin->getFloat();
        const size_t numPhi = cin->getInt();
        futures.push_back([=]() { scene->add(SceneGraph::createPointSphere(p, r, pointR, numPhi, SceneGraph::ORIENTED_DISC, new OBJMaterial)); });
      }, "--oriented-disc-sphere p.x p.y p.z r pointR numPhi: adds a sphere at position p with radius r and tessellation numPhi build of oriented discs.");

    registerOption("print-cameras", [this] (Ref<ParseStream> cin, const FileName& path) {
        print_scene_cameras = true;
      }, "--print-cameras: prints all camera names of the scene");

    registerOption("camera", [this] (Ref<ParseStream> cin, const FileName& path) {
        camera_name = cin->getString();
      }, "--camera: use camera with specified name");
  }